

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

Value * __thiscall camp::Args::operator[](Args *this,size_t index)

{
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  size_type size;
  const_reference pvVar2;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_type local_18;
  size_t index_local;
  Args *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = std::vector<camp::Value,_std::allocator<camp::Value>_>::size(&this->m_values);
  if (sVar1 <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    sVar1 = local_18;
    size = std::vector<camp::Value,_std::allocator<camp::Value>_>::size(&this->m_values);
    OutOfRange::OutOfRange(&local_60,sVar1,size);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/args.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"const Value &camp::Args::operator[](std::size_t) const",&local_b9);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x60,(string *)local_b8);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  pvVar2 = std::vector<camp::Value,_std::allocator<camp::Value>_>::operator[]
                     (&this->m_values,local_18);
  return pvVar2;
}

Assistant:

const Value& Args::operator[](std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_values.size())
        CAMP_ERROR(OutOfRange(index, m_values.size()));

    return m_values[index];
}